

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O2

void __thiscall Nonogram::set_horizontal(Nonogram *this,Known *known,uint y)

{
  const_reference cVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  int i;
  size_type __n;
  reference rVar5;
  
  lVar4 = 0;
  for (__n = 0; (long)__n < (long)this->m_x; __n = __n + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&known->first,__n);
    if (cVar1) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&known->first,__n);
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         ((long)&(((this->m_set).
                                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data + lVar4),(ulong)y);
      puVar2 = rVar5._M_p;
      if (cVar1) {
        uVar3 = rVar5._M_mask | *puVar2;
      }
      else {
        uVar3 = ~rVar5._M_mask & *puVar2;
      }
      *puVar2 = uVar3;
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&known->second,__n);
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         ((long)&(((this->m_value).
                                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data + lVar4),(ulong)y);
      puVar2 = rVar5._M_p;
      if (cVar1) {
        uVar3 = rVar5._M_mask | *puVar2;
      }
      else {
        uVar3 = ~rVar5._M_mask & *puVar2;
      }
      *puVar2 = uVar3;
    }
    lVar4 = lVar4 + 0x28;
  }
  return;
}

Assistant:

void Nonogram::set_horizontal(const Known &known, unsigned int y) {
    for (int i = 0; i < m_x; i++) {
        if (known.first[i]) {
            m_set[i][y] = known.first[i];
            m_value[i][y] = known.second[i];
        }
    }
}